

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_objectwriter.h
# Opt level: O2

void __thiscall
google::protobuf::util::converter::JsonObjectWriter::WriteChar(JsonObjectWriter *this,char c)

{
  char local_9 [8];
  char c_local;
  
  local_9[0] = c;
  io::CodedOutputStream::WriteRaw(this->stream_,local_9,1);
  return;
}

Assistant:

void WriteChar(const char c) { stream_->WriteRaw(&c, sizeof(c)); }